

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * __thiscall
QUtil::read_file_into_string_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,FILE *f,string_view filename)

{
  int iVar1;
  int iVar2;
  QUtil *this_00;
  QUtil *this_01;
  runtime_error *prVar3;
  long *plVar4;
  size_type *psVar5;
  size_t sVar6;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  size_t local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  iVar2 = (int)filename._M_str;
  local_f8 = filename._M_len;
  fseek((FILE *)this,0,2);
  this_00 = (QUtil *)ftello((FILE *)this);
  if ((long)this_00 < 0) {
    sVar6 = 0x2000;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_118,'\0');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while (sVar6 == 0x2000) {
      sVar6 = fread(local_118._M_dataplus._M_p,1,0x2000,(FILE *)this);
      if (local_118._M_string_length < sVar6) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   sVar6);
      }
      local_118._M_dataplus._M_p[sVar6] = '\0';
      local_118._M_string_length = sVar6;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_118._M_dataplus._M_p);
    }
    iVar2 = ferror((FILE *)this);
    if (iVar2 != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"failure reading file ","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,local_f8,f + local_f8);
      std::operator+(&local_d0,&local_138,&local_f0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_158._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_158._M_dataplus._M_p == psVar5) {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158.field_2._8_8_ = plVar4[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar5;
      }
      local_158._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(prVar3,(string *)&local_158);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    fseek((FILE *)this,0,0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)this_00);
    this_01 = (QUtil *)fread((__return_storage_ptr__->_M_dataplus)._M_p,1,(size_t)this_00,
                             (FILE *)this);
    if (this_01 != this_00) {
      iVar1 = ferror((FILE *)this);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      if (iVar1 == 0) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"premature eof reading file ","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,local_f8,f + local_f8);
        std::operator+(&local_f0,&local_90,&local_b0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_138._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_138._M_dataplus._M_p == psVar5) {
          local_138.field_2._M_allocated_capacity = *psVar5;
          local_138.field_2._8_8_ = plVar4[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar5;
        }
        local_138._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        uint_to_string_base_abi_cxx11_(&local_50,this_01,10,0,iVar2);
        std::operator+(&local_d0,&local_138,&local_50);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_158._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar5) {
          local_158.field_2._M_allocated_capacity = *psVar5;
          local_158.field_2._8_8_ = plVar4[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar5;
        }
        local_158._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        uint_to_string_base_abi_cxx11_(&local_70,this_00,10,0,iVar2);
        std::operator+(&local_118,&local_158,&local_70);
        std::runtime_error::runtime_error(prVar3,(string *)&local_118);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"failure reading file ","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,local_f8,f + local_f8);
      std::operator+(&local_f0,&local_90,&local_b0);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_138._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_138._M_dataplus._M_p == psVar5) {
        local_138.field_2._M_allocated_capacity = *psVar5;
        local_138.field_2._8_8_ = plVar4[3];
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = *psVar5;
      }
      local_138._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uint_to_string_base_abi_cxx11_(&local_50,this_01,10,0,iVar2);
      std::operator+(&local_d0,&local_138,&local_50);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_158._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_158._M_dataplus._M_p == psVar5) {
        local_158.field_2._M_allocated_capacity = *psVar5;
        local_158.field_2._8_8_ = plVar4[3];
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      }
      else {
        local_158.field_2._M_allocated_capacity = *psVar5;
      }
      local_158._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uint_to_string_base_abi_cxx11_(&local_70,this_00,10,0,iVar2);
      std::operator+(&local_118,&local_158,&local_70);
      std::runtime_error::runtime_error(prVar3,(string *)&local_118);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::read_file_into_string(FILE* f, std::string_view filename)
{
    fseek(f, 0, SEEK_END);
    auto o_size = QUtil::tell(f);
    if (o_size >= 0) {
        // Seekable file
        auto size = QIntC::to_size(o_size);
        fseek(f, 0, SEEK_SET);
        std::string result(size, '\0');
        if (auto n_read = fread(result.data(), 1, size, f); n_read != size) {
            if (ferror(f)) {
                throw std::runtime_error(
                    std::string("failure reading file ") + std::string(filename) +
                    " into memory: read " + uint_to_string(n_read) + "; wanted " +
                    uint_to_string(size));
            } else {
                throw std::runtime_error(
                    std::string("premature eof reading file ") + std::string(filename) +
                    " into memory: read " + uint_to_string(n_read) + "; wanted " +
                    uint_to_string(size));
            }
        }
        return result;
    } else {
        // Pipe or other non-seekable file
        size_t buf_size = 8192;
        auto n_read = buf_size;
        std::string buffer(buf_size, '\0');
        std::string result;
        while (n_read == buf_size) {
            n_read = fread(buffer.data(), 1, buf_size, f);
            buffer.erase(n_read);
            result.append(buffer);
        }
        if (ferror(f)) {
            throw std::runtime_error(
                std::string("failure reading file ") + std::string(filename) + " into memory");
        }
        return result;
    }
}